

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.cpp
# Opt level: O1

string * __thiscall
duckdb::Blob::FromBase64_abi_cxx11_(string *__return_storage_ptr__,Blob *this,string_t blob)

{
  string_t str;
  data_ptr_t output;
  void *__s;
  undefined8 unaff_RBX;
  idx_t in_R8;
  string_t str_00;
  
  str.value.pointer.ptr = (char *)unaff_RBX;
  str.value._0_8_ = 0x2ce861;
  output = (data_ptr_t)FromBase64Size(str);
  __s = operator_new__((ulong)output);
  switchD_005700f1::default(__s,0,(size_t)output);
  str_00.value.pointer.ptr = (char *)__s;
  str_00.value._0_8_ = blob.value._0_8_;
  FromBase64(this,str_00,output,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__s,(data_ptr_t)((long)__s + (long)output));
  operator_delete__(__s);
  return __return_storage_ptr__;
}

Assistant:

string Blob::FromBase64(string_t blob) {
	auto decoded_size = Blob::FromBase64Size(blob);
	auto data = make_uniq_array<data_t>(decoded_size);
	Blob::FromBase64(blob, data.get(), decoded_size);
	return string(char_ptr_cast(data.get()), decoded_size);
}